

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O1

TPZManVector<int_*,_10> * __thiscall
TPZManVector<int_*,_10>::operator=(TPZManVector<int_*,_10> *this,TPZManVector<int_*,_10> *rval)

{
  long lVar1;
  int **ppiVar2;
  uint uVar3;
  long lVar4;
  int **ppiVar5;
  
  if (this != rval) {
    lVar1 = (rval->super_TPZVec<int_*>).fNElements;
    ppiVar2 = (this->super_TPZVec<int_*>).fStore;
    ppiVar5 = this->fExtAlloc;
    if (ppiVar2 != ppiVar5 && ppiVar2 != (int **)0x0) {
      operator_delete__(ppiVar2);
      (this->super_TPZVec<int_*>).fStore = (int **)0x0;
      (this->super_TPZVec<int_*>).fNAlloc = 0;
    }
    if (lVar1 < 0xb) {
      if (lVar1 < 1) {
        uVar3 = 0;
      }
      else {
        lVar4 = 0;
        do {
          ppiVar5[lVar4] = rval->fExtAlloc[lVar4];
          lVar4 = lVar4 + 1;
        } while (lVar1 != lVar4);
        uVar3 = (uint)lVar1;
      }
      if (uVar3 < 10) {
        memset(this->fExtAlloc + uVar3,0,(ulong)(9 - uVar3) * 8 + 8);
        lVar4 = 0;
      }
      else {
        lVar4 = 0;
      }
    }
    else {
      ppiVar5 = (rval->super_TPZVec<int_*>).fStore;
      lVar4 = lVar1;
    }
    (this->super_TPZVec<int_*>).fStore = ppiVar5;
    (this->super_TPZVec<int_*>).fNAlloc = lVar4;
    (this->super_TPZVec<int_*>).fNElements = lVar1;
  }
  (rval->super_TPZVec<int_*>).fStore = (int **)0x0;
  (rval->super_TPZVec<int_*>).fNElements = 0;
  (rval->super_TPZVec<int_*>).fNAlloc = 0;
  return this;
}

Assistant:

TPZManVector< T, NumExtAlloc >& TPZManVector< T, NumExtAlloc >::operator=(TPZManVector< T, NumExtAlloc >&& rval) {
    // Checking auto assignment.
    if (this != &rval) {
      const int64_t nel = rval.NElements();
      //let us dispose of previously allocated memory
      if (this->fStore && this->fStore != fExtAlloc) {
        delete[] this->fStore;
        this->fStore = nullptr;
        this->fNAlloc = 0;
      }
      if (nel <= NumExtAlloc) {
        //we need to copy, unfortunately
        int i = 0;
        for(; i < nel; i++) {fExtAlloc[i] = rval.fExtAlloc[i];}
        for(; i < NumExtAlloc; i++){fExtAlloc[i] = T();}
        this->fStore = fExtAlloc;
        this->fNAlloc = 0;
        this->fNElements = nel;
      } else {
        this->fStore = rval.fStore;
        this->fNAlloc = nel;
        this->fNElements = nel;
      }
    }
    rval.fStore = nullptr;
    rval.fNAlloc = 0;
    rval.fNElements = 0;
    return *this;
}